

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O3

void m_throw(monst *mon,int x,int y,int dx,int dy,int range,obj *obj)

{
  char cVar1;
  monst *mtmp;
  char cVar2;
  int iVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  obj *poVar8;
  char *pcVar9;
  uchar aatyp;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  bool bVar14;
  obj *singleobj;
  char knmbuf [256];
  char onmbuf [256];
  obj *local_240;
  char local_238 [256];
  char local_138 [264];
  
  cVar1 = obj->oclass;
  bhitpos.x = (xchar)x;
  bhitpos.y = (xchar)y;
  if (obj->quan == 1) {
    if (mon->mw == obj) {
      setmnotwielded(mon,obj);
      mon->mw = (obj *)0x0;
    }
    obj_extract_self(obj);
    local_240 = obj;
    poVar8 = obj;
    obj = (obj *)0x0;
  }
  else {
    poVar8 = splitobj(obj,1);
    local_240 = poVar8;
    obj_extract_self(poVar8);
  }
  poVar8->owornmask = 0;
  if ((poVar8->field_0x4a & 1) != 0) {
    if (dy == 0 && dx == 0) {
      dy = 0;
      dx = 0;
    }
    else {
      uVar5 = mt_random();
      if (uVar5 * -0x49249249 < 0x24924925) {
        if (mon->wormno == '\0') {
          if ((viz_array[mon->my][mon->mx] & 2U) != 0) goto LAB_001f55e9;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f5582;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f5579;
          }
          else {
LAB_001f5579:
            if (ublindf == (obj *)0x0) goto LAB_001f56ca;
LAB_001f5582:
            if (ublindf->oartifact != '\x1d') goto LAB_001f56ca;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[mon->my][mon->mx] & 1U) != 0)) && ((mon->data->mflags3 & 0x200) != 0))
          goto LAB_001f55e9;
        }
        else {
          bVar4 = worm_known(level,mon);
          if (bVar4 != '\0') {
LAB_001f55e9:
            uVar5 = *(uint *)&mon->field_0x60;
            if ((((uVar5 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar5 & 0x280) == 0) goto LAB_001f563c;
            }
            else if (((uVar5 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001f563c:
              if (((u._1052_1_ & 0x20) == 0) && (flags.verbose != '\0')) {
                if (((poVar8->oclass == '\r') || (poVar8->oclass == '\x02')) &&
                   ((byte)(objects[poVar8->otyp].oc_subtyp + 0x18U) < 3)) {
                  pcVar9 = Monnam(mon);
                  pline("%s misfires!",pcVar9);
                }
                else {
                  pcVar9 = Tobjnam(poVar8,"slip");
                  pcVar12 = mon_nam(mon);
                  pline("%s as %s throws it!",pcVar9,pcVar12);
                }
              }
            }
          }
        }
LAB_001f56ca:
        uVar5 = mt_random();
        dx = ~((uVar5 / 3) * 3) + uVar5;
        uVar5 = mt_random();
        dy = ~((uVar5 / 3) * 3) + uVar5;
        if (dx == 0 && dy == 0) goto LAB_001f577c;
      }
    }
  }
  if (((0x4e < (dx + bhitpos.x) - 1U) || (uVar5 = bhitpos.y + dy, 0x14 < uVar5)) ||
     ((uVar10 = bhitpos.x + dx, level->locations[uVar10][uVar5].typ < '\x11' ||
      (bVar4 = closed_door(level,uVar10,uVar5), bVar4 != '\0')))) {
LAB_001f577c:
    drop_throw(mon,poVar8,obj,'\0','\0',(int)bhitpos.x,(int)bhitpos.y);
    return;
  }
  if ((level->locations[dx + bhitpos.x][bhitpos.y + dy].typ == '\x16') &&
     (bVar4 = hits_bars(&local_240,(int)bhitpos.x,(int)bhitpos.y,dx,dy,0,0), poVar8 = local_240,
     bVar4 != '\0')) goto LAB_001f577c;
  if (cVar1 != '\0') {
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
      iVar11 = (int)local_240->otyp;
    }
    else {
      iVar11 = display_rng(0x219);
      iVar11 = iVar11 + 1;
    }
    tmp_at(-4,iVar11 + 1);
  }
  if (0 < range) {
    iVar11 = range + -1;
    do {
      bhitpos.x = bhitpos.x + (char)dx;
      bhitpos.y = bhitpos.y + (char)dy;
      mtmp = level->monsters[bhitpos.x][bhitpos.y];
      if ((mtmp == (monst *)0x0) || ((mtmp->field_0x61 & 2) != 0)) {
        if ((bhitpos.x == u.ux) && (bhitpos.y == u.uy)) {
          if (multi != 0) {
            nomul(0,(char *)0x0);
          }
          poVar8 = local_240;
          if (local_240->oclass == '\r') {
            uVar5 = (uint)local_240->otyp;
            if ((((int)uVar5 < 0x20f) && ((youmonst.data)->mlet == '\x15')) &&
               (((youmonst.data)->mflags2 & 0x20000000) != 0)) {
              if (local_240->otyp < 0x206) {
                pcVar9 = mon_nam(mon);
                pcVar9 = s_suffix(pcVar9);
                uVar5 = 0;
                pline("You accept %s gift in the spirit in which it was intended.",pcVar9);
                pcVar9 = xname(poVar8);
                hold_another_object(poVar8,"You catch, but drop, %s.",pcVar9,"You catch:");
              }
              else {
                pcVar9 = xname(local_240);
                uVar5 = 0;
                pline("You catch the %s.",pcVar9);
                pcVar9 = mon_nam(mon);
                pcVar9 = s_suffix(pcVar9);
                pline("You are not interested in %s junk.",pcVar9);
                discover_object((int)poVar8->otyp,'\x01','\x01');
                dropy(poVar8);
              }
              goto LAB_001f602a;
            }
          }
          else {
            if (local_240->oclass == '\b') {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f5d86;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f5d81;
LAB_001f5dac:
                local_240->field_0x4a = local_240->field_0x4a | 0x20;
              }
              else {
LAB_001f5d81:
                if (ublindf != (obj *)0x0) {
LAB_001f5d86:
                  if (ublindf->oartifact == '\x1d') goto LAB_001f5dac;
                }
              }
              uVar5 = 0;
              potionhit(&youmonst,local_240,'\0');
              goto LAB_001f602a;
            }
            uVar5 = (uint)(ushort)local_240->otyp;
          }
          uVar5 = uVar5 & 0xffff;
          if ((uVar5 == 0x218) || (uVar5 == 0x120)) {
LAB_001f5ac3:
            iVar6 = thitu(8,0,local_240,obj,mon,(char *)0x0);
LAB_001f5bc2:
            if (iVar6 != 0) {
              if ((((poVar8->field_0x4b & 0x80) != 0) && (poVar8->oclass == '\x02')) &&
                 ((byte)(objects[poVar8->otyp].oc_subtyp + 0x1aU) < 5)) {
                pcVar9 = xname(poVar8);
                strcpy(local_138,pcVar9);
                pcVar9 = killer_xname(poVar8);
                strcpy(local_238,pcVar9);
                poisoned(local_138,0,local_238,-10);
              }
              aatyp = 0xfe;
              if (poVar8->otyp == 0x218) {
                aatyp = '\n';
              }
              uVar5 = 0;
              bVar4 = can_blnd((monst *)0x0,&youmonst,aatyp,poVar8);
              if (bVar4 != '\0') {
                uVar5 = mt_random();
                uVar5 = uVar5 % 0x19 + 1;
                if (poVar8->otyp == 0x218) {
                  uVar10 = (youmonst.data)->mflags1;
                  bVar13 = youmonst.data == mons + 0x17b;
                  bVar14 = youmonst.data == mons + 0x1e;
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if (ublindf == (obj *)0x0) {
                      if ((uVar10 >> 0xc & 1) != 0) goto LAB_001f5f58;
                    }
                    else if (((uVar10 >> 0xc & 1) != 0) || (ublindf->otyp != 0xed))
                    goto LAB_001f5e93;
LAB_001f5f70:
                    pline("The venom blinds you.");
                  }
                  else {
                    if (ublindf != (obj *)0x0) {
LAB_001f5e93:
                      if (ublindf->oartifact == '\x1d') goto LAB_001f5f70;
                    }
LAB_001f5f58:
                    pcVar9 = body_part(1);
                    if ((uVar10 >> 0xc & 1) == 0 && (bVar14 || bVar13)) {
                      pcVar12 = "s";
                    }
                    else {
                      pcVar9 = makeplural(pcVar9);
                      pcVar12 = "";
                    }
                    pline("Your %s sting%s.",pcVar9,pcVar12);
                  }
                }
                else if (poVar8->otyp == 0x120) {
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f5d4b;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f5d46;
LAB_001f5ec1:
                    bVar4 = piday();
                    pcVar9 = "pied";
                    if (bVar4 == '\0') {
                      pcVar9 = "creamed";
                    }
                    pcVar12 = "Yecch!  You\'ve been %s.";
                  }
                  else {
LAB_001f5d46:
                    if (ublindf != (obj *)0x0) {
LAB_001f5d4b:
                      if (ublindf->oartifact == '\x1d') goto LAB_001f5ec1;
                    }
                    pcVar9 = body_part(2);
                    pcVar12 = "There\'s something sticky all over your %s.";
                  }
                  pline(pcVar12,pcVar9);
                }
              }
              if ((((poVar8->otyp == 0x10f) && (u.uprops[8].extrinsic == 0)) &&
                  (((byte)youmonst.mintrinsics & 0x80) == 0)) &&
                 ((bVar4 = poly_when_stoned(youmonst.data), bVar4 == '\0' ||
                  (iVar11 = polymon(0x108), iVar11 == 0)))) {
                u.uprops[0x21].intrinsic = 5;
                killer = (char *)0x0;
              }
              stop_occupation();
              bVar4 = '\x01';
              cVar1 = u.ux;
              cVar2 = u.uy;
              goto LAB_001f601e;
            }
          }
          else {
            if (uVar5 != 0x10f) {
              iVar6 = dmgval(mon,local_240,'\x01',&youmonst);
              iVar7 = distmin((int)u.ux,(int)u.uy,(int)mon->mx,(int)mon->my);
              iVar7 = 3 - iVar7;
              if (iVar7 < -3) {
                iVar7 = -4;
              }
              if (((mon->data->mflags2 & 0x10) != 0) && (objects[poVar8->otyp].oc_subtyp == '\x16'))
              {
                iVar3 = iVar7 + 1;
                if ((mon->mw != (obj *)0x0) && (mon->mw->otyp == 0x43)) {
                  iVar3 = iVar7 + 2;
                }
                iVar7 = iVar3;
                iVar6 = iVar6 + (uint)(poVar8->otyp == 2);
              }
              if (iVar6 < 2) {
                iVar6 = 1;
              }
              iVar6 = thitu((iVar7 - (uint)((youmonst.data)->msize < 3)) + (int)poVar8->spe + 9,
                            iVar6,poVar8,obj,mon,(char *)0x0);
              goto LAB_001f5bc2;
            }
            if (local_240->corpsenm - 0xbU < 2) goto LAB_001f5ac3;
            warning("monster throwing egg type %d");
          }
          stop_occupation();
          if (iVar11 != 0) goto LAB_001f5bdb;
          bVar4 = '\0';
          uVar5 = 0;
          cVar1 = u.ux;
          cVar2 = u.uy;
        }
        else {
          if ((((iVar11 != 0) && ((dx + bhitpos.x) - 1U < 0x4f)) &&
              (uVar5 = bhitpos.y + dy, uVar5 < 0x15)) &&
             ((uVar10 = bhitpos.x + dx, '\x10' < level->locations[uVar10][uVar5].typ &&
              (bVar4 = closed_door(level,uVar10,uVar5), bVar4 == '\0')))) {
            iVar7 = (int)bhitpos.x;
            iVar6 = (int)bhitpos.y;
            if (level->locations[dx + iVar7][dy + iVar6].typ == '\x16') {
              uVar5 = mt_random();
              bVar4 = hits_bars(&local_240,iVar7,iVar6,dx,dy,
                                (uint)(uVar5 * -0x33333333 < 0x33333334),0);
              if (bVar4 != '\0') goto LAB_001f5c10;
            }
            if (level->locations[bhitpos.x][bhitpos.y].typ != '\x1f') goto LAB_001f5bdb;
          }
LAB_001f5c10:
          if (local_240 == (obj *)0x0) break;
          uVar5 = 0;
          bVar4 = '\0';
          poVar8 = local_240;
          cVar1 = bhitpos.x;
          cVar2 = bhitpos.y;
        }
LAB_001f601e:
        drop_throw(mon,poVar8,obj,bVar4,bVar4,(int)cVar1,(int)cVar2);
        goto LAB_001f602a;
      }
      iVar6 = ohitmon(mon,mtmp,local_240,obj,iVar11,'\x01');
      if (iVar6 != 0) break;
LAB_001f5bdb:
      tmp_at((int)bhitpos.x,(int)bhitpos.y);
      (*windowprocs.win_delay)();
      uVar5 = iVar11 + 1;
      iVar11 = iVar11 + -1;
    } while (1 < uVar5);
  }
  uVar5 = 0;
LAB_001f602a:
  tmp_at((int)bhitpos.x,(int)bhitpos.y);
  (*windowprocs.win_delay)();
  tmp_at(-6,0);
  if (uVar5 == 0) {
    return;
  }
  u.ucreamed = u.ucreamed + uVar5;
  make_blinded((ulong)uVar5 + (ulong)u.uprops[0x1e].intrinsic,'\0');
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) goto LAB_001f60e5;
      goto LAB_001f608b;
    }
  }
  else {
LAB_001f608b:
    if (ublindf == (obj *)0x0) goto LAB_001f6096;
  }
  if (ublindf->oartifact == '\x1d') {
LAB_001f60e5:
    pline("Your vision quickly clears.");
    return;
  }
LAB_001f6096:
  if (flags.verbose == '\0') {
    return;
  }
  pcVar9 = body_part(2);
  pline("Use the command #wipe to clean your %s.",pcVar9);
  return;
}

Assistant:

void m_throw(struct monst *mon, int x, int y, int dx, int dy,
	     int range, struct obj *obj)
{
	struct monst *mtmp;
	struct obj *singleobj, *ostack;
	char sym = obj->oclass;
	int hitu, blindinc = 0;

	bhitpos.x = x;
	bhitpos.y = y;

	if (obj->quan == 1L) {
	    /*
	     * Remove object from minvent.  This cannot be done later on;
	     * what if the player dies before then, leaving the monster
	     * with 0 daggers?  (This caused the infamous 2^32-1 orcish
	     * dagger bug).
	     *
	     * VENOM is not in minvent - it should already be OBJ_FREE.
	     * The extract below does nothing.
	     */

	    /* not possibly_unwield, which checks the object's */
	    /* location, not its existence */
	    if (MON_WEP(mon) == obj) {
		    setmnotwielded(mon,obj);
		    MON_NOWEP(mon);
	    }
	    obj_extract_self(obj);
	    ostack = NULL;
	    singleobj = obj;
	    obj = NULL;
	} else {
	    ostack = obj;
	    singleobj = splitobj(obj, 1L);
	    obj_extract_self(singleobj);
	}

	singleobj->owornmask = 0; /* threw one of multiple weapons in hand? */

	if (singleobj->cursed && (dx || dy) && !rn2(7)) {
	    if (canseemon(level, mon) && flags.verbose) {
		if (is_ammo(singleobj))
		    pline("%s misfires!", Monnam(mon));
		else
		    pline("%s as %s throws it!",
			  Tobjnam(singleobj, "slip"), mon_nam(mon));
	    }
	    dx = rn2(3)-1;
	    dy = rn2(3)-1;
	    /* check validity of new direction */
	    if (!dx && !dy) {
		drop_throw(mon, singleobj, ostack, FALSE, FALSE,
			   bhitpos.x, bhitpos.y);
		return;
	    }
	}

	/* pre-check for doors, walls and boundaries.
	   Also need to pre-check for bars regardless of direction;
	   the random chance for small objects hitting bars is
	   skipped when reaching them at point blank range */
	if (!isok(bhitpos.x+dx,bhitpos.y+dy)
	    || IS_ROCK(level->locations[bhitpos.x+dx][bhitpos.y+dy].typ)
	    || closed_door(level, bhitpos.x+dx, bhitpos.y+dy)
	    || (level->locations[bhitpos.x + dx][bhitpos.y + dy].typ == IRONBARS &&
		hits_bars(&singleobj, bhitpos.x, bhitpos.y, dx, dy, 0, 0))) {
	    drop_throw(mon, singleobj, ostack, FALSE, FALSE,
		       bhitpos.x, bhitpos.y);
	    return;
	}

	/* Note: drop_throw may destroy singleobj.  Since obj must be destroyed
	 * early to avoid the dagger bug, anyone who modifies this code should
	 * be careful not to use either one after it's been freed.
	 */
	if (sym)
	    tmp_at(DISP_OBJECT, dbuf_objid(singleobj));
	
	while (range-- > 0) { /* Actually the loop is always exited by break */
		bhitpos.x += dx;
		bhitpos.y += dy;
		if ((mtmp = m_at(level, bhitpos.x, bhitpos.y)) != 0) {
		    if (ohitmon(mon, mtmp, singleobj, ostack, range, TRUE))
			break;
		} else if (bhitpos.x == u.ux && bhitpos.y == u.uy) {
		    if (multi) nomul(0, NULL);

		    if (singleobj->oclass == GEM_CLASS &&
			    singleobj->otyp <= LAST_GEM+9 /* 9 glass colors */
			    && is_unicorn(youmonst.data)) {
			if (singleobj->otyp > LAST_GEM) {
			    pline("You catch the %s.", xname(singleobj));
			    pline("You are not interested in %s junk.",
				s_suffix(mon_nam(mon)));
			    makeknown(singleobj->otyp);
			    dropy(singleobj);
			} else {
			    pline("You accept %s gift in the spirit in which it was intended.",
				s_suffix(mon_nam(mon)));
			    hold_another_object(singleobj,
				"You catch, but drop, %s.", xname(singleobj),
				"You catch:");
			}
			break;
		    }
		    if (singleobj->oclass == POTION_CLASS) {
			if (!Blind) singleobj->dknown = 1;
			potionhit(&youmonst, singleobj, FALSE);
			break;
		    }
		    switch(singleobj->otyp) {
			int dam, hitv;
			case EGG:
			    if (!touch_petrifies(&mons[singleobj->corpsenm])) {
				warning("monster throwing egg type %d",
					singleobj->corpsenm);
				hitu = 0;
				break;
			    }
			    /* fall through */
			case CREAM_PIE:
			case BLINDING_VENOM:
			    hitu = thitu(8, 0, singleobj, ostack, mon, NULL);
			    break;
			default:
			    dam = dmgval(mon, singleobj, TRUE, &youmonst);
			    hitv = 3 - distmin(u.ux,u.uy, mon->mx,mon->my);
			    if (hitv < -4) hitv = -4;
			    if (is_elf(mon->data) &&
				objects[singleobj->otyp].oc_skill == P_BOW) {
				hitv++;
				if (MON_WEP(mon) &&
				    MON_WEP(mon)->otyp == ELVEN_BOW)
				    hitv++;
				if (singleobj->otyp == ELVEN_ARROW) dam++;
			    }
			    if (bigmonst(youmonst.data)) hitv++;
			    hitv += 8 + singleobj->spe;
			    if (dam < 1) dam = 1;
			    hitu = thitu(hitv, dam, singleobj, ostack, mon, NULL);
		    }
		    if (hitu && singleobj->opoisoned &&
			is_poisonable(singleobj)) {
			char onmbuf[BUFSZ], knmbuf[BUFSZ];

			strcpy(onmbuf, xname(singleobj));
			strcpy(knmbuf, killer_xname(singleobj));
			poisoned(onmbuf, A_STR, knmbuf, -10);
		    }
		    if (hitu &&
		       can_blnd(NULL, &youmonst,
				(uchar)(singleobj->otyp == BLINDING_VENOM ?
					AT_SPIT : AT_WEAP), singleobj)) {
			blindinc = rnd(25);
			if (singleobj->otyp == CREAM_PIE) {
			    if (!Blind) pline("Yecch!  You've been %s.",
					      piday() ? "pied" : "creamed");
			    else pline("There's something sticky all over your %s.",
				       body_part(FACE));
			} else if (singleobj->otyp == BLINDING_VENOM) {
			    int num_eyes = eyecount(youmonst.data);
			    /* venom in the eyes */
			    if (!Blind) pline("The venom blinds you.");
			    else pline("Your %s sting%s.",
				      (num_eyes == 1) ? body_part(EYE) :
						makeplural(body_part(EYE)),
				      (num_eyes == 1) ? "s" : "");
			}
		    }
		    if (hitu && singleobj->otyp == EGG) {
			if (!Stone_resistance
			    && !(poly_when_stoned(youmonst.data) &&
				 polymon(PM_STONE_GOLEM))) {
			    Stoned = 5;
			    killer = NULL;
			}
		    }
		    stop_occupation();
		    if (hitu || !range) {
			drop_throw(mon, singleobj, ostack, hitu, hitu,
				   u.ux, u.uy);
			break;
		    }
		} else if (!range	/* reached end of path */
			/* missile hits edge of screen */
			|| !isok(bhitpos.x+dx,bhitpos.y+dy)
			/* missile hits the wall */
			|| IS_ROCK(level->locations[bhitpos.x+dx][bhitpos.y+dy].typ)
			/* missile hit closed door */
			|| closed_door(level, bhitpos.x+dx, bhitpos.y+dy)
			/* missile might hit iron bars */
			|| (level->locations[bhitpos.x+dx][bhitpos.y+dy].typ == IRONBARS &&
			hits_bars(&singleobj, bhitpos.x, bhitpos.y, dx, dy, !rn2(5), 0))
			/* Thrown objects "sink" */
			|| IS_SINK(level->locations[bhitpos.x][bhitpos.y].typ)) {
		    if (singleobj) { /* hits_bars might have destroyed it */
			drop_throw(mon, singleobj, ostack, FALSE, FALSE,
				   bhitpos.x, bhitpos.y);
		    }
		    break;
		}
		tmp_at(bhitpos.x, bhitpos.y);
		win_delay_output();
	}
	tmp_at(bhitpos.x, bhitpos.y);
	win_delay_output();
	tmp_at(DISP_END, 0);

	if (blindinc) {
		u.ucreamed += blindinc;
		make_blinded(Blinded + (long)blindinc, FALSE);
		if (!Blind)
		    pline("Your vision quickly clears.");
		else if (flags.verbose)
		    pline("Use the command #wipe to clean your %s.", body_part(FACE));
	}
}